

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutCut.c
# Opt level: O2

void Cut_CutPrint(Cut_Cut_t *pCut,int fSeq)

{
  ulong uVar1;
  char *__format;
  ulong uVar2;
  
  if (*(uint *)pCut < 0x10000000) {
    __assert_fail("pCut->nLeaves > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/cut/cutCut.c"
                  ,0x117,"void Cut_CutPrint(Cut_Cut_t *, int)");
  }
  printf("%d : {",(ulong)(*(uint *)pCut >> 0x1c));
  uVar2 = 0;
  do {
    if (*(uint *)pCut >> 0x1c <= uVar2) {
      printf(" }");
      return;
    }
    uVar1 = (ulong)*(uint *)(&pCut[1].field_0x0 + uVar2 * 4);
    if (fSeq == 0) {
      __format = " %d";
LAB_003a2f57:
      printf(__format,uVar1);
    }
    else {
      printf(" %d",(ulong)(uint)((int)*(uint *)(&pCut[1].field_0x0 + uVar2 * 4) >> 8));
      uVar1 = (ulong)(byte)(&pCut[1].field_0x0)[uVar2 * 4];
      if ((&pCut[1].field_0x0)[uVar2 * 4] != 0) {
        __format = "(%d)";
        goto LAB_003a2f57;
      }
    }
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

void Cut_CutPrint( Cut_Cut_t * pCut, int fSeq )
{
    int i;
    assert( pCut->nLeaves > 0 );
    printf( "%d : {", pCut->nLeaves );
    for ( i = 0; i < (int)pCut->nLeaves; i++ )
    {
        if ( fSeq )
        {
            printf( " %d", pCut->pLeaves[i] >> CUT_SHIFT );
            if ( pCut->pLeaves[i] & CUT_MASK )
                printf( "(%d)", pCut->pLeaves[i] & CUT_MASK );
        }
        else
            printf( " %d", pCut->pLeaves[i] );
    }
    printf( " }" );
//    printf( "\nSign = " );
//    Extra_PrintBinary( stdout, &pCut->uSign, 32 );
}